

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::InputScalarAsWidgetReplacement
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *data_ptr,
               char *format)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  char *fmt;
  ImGuiInputTextFlags flags;
  ImGuiContext *g;
  float fVar4;
  double dVar5;
  char data_buf [32];
  char fmt_buf [32];
  char local_88 [40];
  ImVec2 local_60;
  char local_58 [40];
  
  pIVar1 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  SetActiveID(pIVar1->ScalarAsInputTextId,window);
  pIVar1->ActiveIdAllowNavDirFlags = 0xc;
  pIVar2 = GImGui;
  GImGui->HoveredId = 0;
  pIVar2->HoveredIdAllowOverlap = false;
  pIVar2->HoveredIdTimer = 0.0;
  window->FocusIdxAllCounter = window->FocusIdxAllCounter + -1;
  window->FocusIdxTabCounter = window->FocusIdxTabCounter + -1;
  fmt = ParseFormatTrimDecorations((ImGui *)format,local_58,(char *)0x20,0);
  if (data_type < ImGuiDataType_Float) {
    ImFormatString(local_88,0x20,fmt,(ulong)*data_ptr);
  }
  else {
    if (data_type == ImGuiDataType_Double) {
      dVar5 = *data_ptr;
    }
    else {
      if (data_type != ImGuiDataType_Float) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0x2104,
                      "int DataTypeFormatString(char *, int, ImGuiDataType, const void *, const char *)"
                     );
      }
      dVar5 = (double)*data_ptr;
    }
    ImFormatString(local_88,0x20,fmt,dVar5);
  }
  flags = 0x11;
  if ((data_type & ~ImGuiDataType_Uint32) == ImGuiDataType_Float) {
    flags = 0x20010;
  }
  local_60.x = (bb->Max).x - (bb->Min).x;
  local_60.y = (bb->Max).y - (bb->Min).y;
  bVar3 = InputTextEx(label,local_88,0x20,&local_60,flags,(ImGuiTextEditCallback)0x0,(void *)0x0);
  if (pIVar1->ScalarAsInputTextId == 0) {
    if (pIVar1->ActiveId != id) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0x2199,
                    "bool ImGui::InputScalarAsWidgetReplacement(const ImRect &, ImGuiID, const char *, ImGuiDataType, void *, const char *)"
                   );
    }
    pIVar1->ScalarAsInputTextId = pIVar1->ActiveId;
    pIVar2 = GImGui;
    GImGui->HoveredId = id;
    pIVar2->HoveredIdAllowOverlap = false;
    fVar4 = 0.0;
    if ((id != 0) && (fVar4 = 0.0, pIVar2->HoveredIdPreviousFrame == id)) {
      fVar4 = pIVar2->HoveredIdTimer + (pIVar2->IO).DeltaTime;
    }
    pIVar2->HoveredIdTimer = fVar4;
  }
  if (bVar3) {
    bVar3 = DataTypeApplyOpFromText
                      (local_88,(pIVar1->InputTextState).InitialText.Data,data_type,data_ptr,
                       (char *)0x0);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::InputScalarAsWidgetReplacement(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* data_ptr, const char* format)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Our replacement widget will override the focus ID (registered previously to allow for a TAB focus to happen)
    // On the first frame, g.ScalarAsInputTextId == 0, then on subsequent frames it becomes == id
    SetActiveID(g.ScalarAsInputTextId, window);
    g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
    SetHoveredID(0);
    FocusableItemUnregister(window);

    char fmt_buf[32];
    char data_buf[32];
    format = ParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, data_ptr, format);
    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = InputTextEx(label, data_buf, IM_ARRAYSIZE(data_buf), bb.GetSize(), flags);
    if (g.ScalarAsInputTextId == 0)     // First frame we started displaying the InputText widget
    {
        IM_ASSERT(g.ActiveId == id);    // InputText ID expected to match the Slider ID
        g.ScalarAsInputTextId = g.ActiveId;
        SetHoveredID(id);
    }
    if (value_changed)
        return DataTypeApplyOpFromText(data_buf, g.InputTextState.InitialText.begin(), data_type, data_ptr, NULL);
    return false;
}